

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<9>::Type<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (Type<9> *this,HEAD *head,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT)

{
  double dVar1;
  double AWR;
  int MF;
  long lVar2;
  int in_stack_ffffffffffffff98;
  vector<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  local_48;
  
  MF = (head->super_StructureDivision).tail.fields._M_elems[2];
  dVar1 = (head->super_StructureDivision).base.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  AWR = (head->super_StructureDivision).base.fields.
        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
        _M_head_impl;
  lVar2 = (head->super_StructureDivision).base.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
          _M_head_impl;
  readSequence<njoy::ENDFtk::section::Type<9>::ReactionProduct,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&local_48,(ENDFtk *)begin,end,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)(ulong)(uint)MAT,9,MF,
             (int)((_Head_base<4UL,_long,_false> *)
                  ((long)&(head->super_StructureDivision).base.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl,
             in_stack_ffffffffffffff98);
  dVar1 = round(dVar1);
  Base::Base(&this->super_Base,(int)dVar1,AWR,MF);
  *(int *)&(this->super_Base).field_0x14 = (int)lVar2;
  (this->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->products_).
  super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<njoy::ENDFtk::section::Type<9>::ReactionProduct,_std::allocator<njoy::ENDFtk::section::Type<9>::ReactionProduct>_>
  ::~vector(&local_48);
  BaseWithoutMT<njoy::ENDFtk::section::Base>::
  readSEND<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (begin,end,lineNumber,MAT,9);
  return;
}

Assistant:

Type ( HEAD& head,
       Iterator& begin,
       const Iterator& end,
       long& lineNumber,
       int MAT )
  try: Type( head.MT(), head.ZA(), head.AWR(), head.L1(),
             readSequence< ReactionProduct >( begin, end, lineNumber,
                                              MAT, 9, head.MT(), head.N1() ) ) {

    readSEND(begin, end, lineNumber, MAT, 9 );
  }
  catch( std::exception& e ) {

    Log::info
    ( "Encountered error while reading section {} of file 9 of material {}",
      head.MT(), MAT );
    throw e;
  }